

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# event.c
# Opt level: O3

void cf_event_delete(cf_event_t *self)

{
  pthread_mutex_destroy((pthread_mutex_t *)&self->mutex);
  pthread_cond_destroy((pthread_cond_t *)&self->cond);
  cf_free_dbg(self,
              "/workspace/llm4binary/github/license_all_cmakelists_25/tkorays[P]CFAST/src/cf/event.c"
              ,"cf_event_delete",0x34);
  return;
}

Assistant:

void cf_event_delete(cf_event_t* self) {
#if defined(CF_OS_WIN)
    if (self->handle) {
        CloseHandle(self->handle);
    }
#else
    pthread_mutex_destroy(&self->mutex);
    pthread_cond_destroy(&self->cond);
#endif
    cf_free(self);
}